

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

Vector * __thiscall KDIS::DATA_TYPE::Vector::operator-=(Vector *this,Vector *Value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar1 = Value->m_f32X;
  uVar3 = Value->m_f32Y;
  uVar2 = this->m_f32X;
  uVar4 = this->m_f32Y;
  this->m_f32X = (KFLOAT32)((float)uVar2 - (float)uVar1);
  this->m_f32Y = (KFLOAT32)((float)uVar4 - (float)uVar3);
  this->m_f32Z = (KFLOAT32)((float)this->m_f32Z - (float)Value->m_f32Z);
  return this;
}

Assistant:

Vector & Vector::operator -= ( const Vector & Value )
{
    m_f32X -= Value.m_f32X;
    m_f32Y -= Value.m_f32Y;
    m_f32Z -= Value.m_f32Z;
    return *this;
}